

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O0

istream * operator>>(istream *i,Boss *b)

{
  Boss *pBVar1;
  ostream *this;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  undefined1 local_308 [8];
  Employee e;
  string local_248;
  allocator local_221;
  string local_220;
  undefined1 local_200 [8];
  Person p;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  Address a;
  undefined1 local_68 [4];
  int n;
  string id1;
  string name1;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  Boss *b_local;
  istream *i_local;
  
  _salaryPerHour1 = b;
  b_local = (Boss *)i;
  std::__cxx11::string::string((string *)(id1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,"",(allocator *)(p.address.street.field_2._M_local_buf + 0xf));
  Address::Address((Address *)local_d0,&local_f0,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)(p.address.street.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,"92*sa11178",(allocator *)((long)&e.workDone + 3));
  Person::Person((Person *)local_200,&local_220,&local_248,(Address *)local_d0);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e.workDone + 3));
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"92*sa11178",&local_351);
  Employee::Employee((Employee *)local_308,&local_328,&local_350,(Address *)local_d0,1,1,1,1);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>((istream *)b_local,(string *)(id1.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>((istream *)b_local,(string *)local_68);
  this = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  operator>>((istream *)b_local,(Address *)local_d0);
  Person::setName((Person *)local_200,(string *)((long)&id1.field_2 + 8));
  Person::setId((Person *)local_200,(string *)local_68);
  Person::setAddress((Person *)local_200,(Address *)local_d0);
  std::operator<<((ostream *)&std::cout,"Enter hour work: ");
  std::istream::operator>>(b_local,&workToDo1);
  std::operator<<((ostream *)&std::cout,"Enter salary per hour: ");
  std::istream::operator>>(b_local,&workDone1);
  std::operator<<((ostream *)&std::cout,"Enter work to do: ");
  std::istream::operator>>(b_local,(int *)(name1.field_2._M_local_buf + 0xc));
  std::operator<<((ostream *)&std::cout,"Enter work done: ");
  std::istream::operator>>(b_local,(int *)(name1.field_2._M_local_buf + 8));
  Employee::setSalaryPerHour((Employee *)local_308,workDone1);
  Employee::setHourWork((Employee *)local_308,workToDo1);
  Employee::setWorkDone((Employee *)local_308,name1.field_2._8_4_);
  Employee::setWorkToDo((Employee *)local_308,name1.field_2._12_4_);
  std::operator<<((ostream *)&std::cout,"Enter number of employee: ");
  std::istream::operator>>(b_local,(int *)(a.street.field_2._M_local_buf + 0xc));
  Boss::setNumberOfEmployee(_salaryPerHour1,a.street.field_2._12_4_);
  pBVar1 = b_local;
  Employee::~Employee((Employee *)local_308);
  Person::~Person((Person *)local_200);
  Address::~Address((Address *)local_d0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(id1.field_2._M_local_buf + 8));
  return (istream *)pBVar1;
}

Assistant:

std::istream &operator>>(istream &i, Boss &b) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    int n;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    Employee e("", "92*sa11178", a, 1, 1, 1, 1);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    cout << "Enter number of employee: ";
    i >> n;
    b.setNumberOfEmployee(n);
    return i;

}